

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

SN_ELEMENT * __thiscall ON_SerialNumberMap::AddSerialNumber(ON_SerialNumberMap *this,ON__UINT64 sn)

{
  ON__UINT32 *pOVar1;
  ON_SerialNumberMapPrivate *pOVar2;
  SN_ELEMENT *pSVar3;
  ON_SN_BLOCK *pOVar4;
  uint uVar5;
  
  if (sn == 0) {
    return (SN_ELEMENT *)0x0;
  }
  pSVar3 = FindElementHelper(this,sn);
  if (pSVar3 != (SN_ELEMENT *)0x0) {
    if (pSVar3->m_sn_active != '\0') {
      return pSVar3;
    }
    this->m_sn_purged = this->m_sn_purged - 1;
    pOVar1 = &this->m_e_blk->m_purged;
    *pOVar1 = *pOVar1 - 1;
    goto LAB_004d0de3;
  }
  pOVar4 = this->m_sn_block0;
  uVar5 = pOVar4->m_count;
  if (uVar5 == 0x2000) {
    GarbageCollectHelper(this);
    pOVar4 = this->m_sn_block0;
    uVar5 = pOVar4->m_count;
  }
  if (uVar5 == 0) {
    pOVar4->m_sn1 = sn;
    pOVar4->m_sn0 = sn;
    pOVar4->m_sorted = 1;
  }
  else if (pOVar4->m_sn1 < sn) {
    pOVar4->m_sn1 = sn;
  }
  else {
    if (sn < pOVar4->m_sn0) {
      pOVar4->m_sn0 = sn;
    }
    pOVar4->m_sorted = 0;
  }
  pOVar2 = this->m_private;
  if (pOVar2->m_maxsn < sn) {
    pOVar2->m_maxsn = sn;
    if (sn < 0xffffffff) {
LAB_004d0dc9:
      pOVar2->m_lower_maxsn = sn;
    }
  }
  else if ((sn < 0xffffffff) && (pOVar2->m_lower_maxsn < sn)) goto LAB_004d0dc9;
  this->m_sn_count = this->m_sn_count + 1;
  pOVar4->m_count = uVar5 + 1;
  pSVar3 = pOVar4->m_sn + uVar5;
LAB_004d0de3:
  pSVar3->m_sn = 0;
  pSVar3->m_sn_active = '\0';
  pSVar3->m_id_active = '\0';
  pSVar3->m_reserved1 = '\0';
  pSVar3->m_reserved2 = '\0';
  pSVar3->m_id_crc32 = 0;
  pSVar3->m_next = (SN_ELEMENT *)0x0;
  (pSVar3->m_value).m_u_type = 0;
  (pSVar3->m_value).m_u32 = 0;
  (pSVar3->m_id).Data1 = 0;
  (pSVar3->m_id).Data2 = 0;
  (pSVar3->m_id).Data3 = 0;
  (pSVar3->m_id).Data4[0] = '\0';
  (pSVar3->m_id).Data4[1] = '\0';
  (pSVar3->m_id).Data4[2] = '\0';
  (pSVar3->m_id).Data4[3] = '\0';
  (pSVar3->m_id).Data4[4] = '\0';
  (pSVar3->m_id).Data4[5] = '\0';
  (pSVar3->m_id).Data4[6] = '\0';
  (pSVar3->m_id).Data4[7] = '\0';
  (pSVar3->m_value).m_u.u64 = 0;
  pSVar3->m_sn = sn;
  pSVar3->m_sn_active = '\x01';
  return pSVar3;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::AddSerialNumber(ON__UINT64 sn)
{
  if ( sn <= 0 )
    return 0;
  struct SN_ELEMENT* e = FindElementHelper(sn);
  if ( e )
  {
    if ( 0 == e->m_sn_active )
    {
      m_sn_purged--;
      m_e_blk->m_purged--;
      memset(e,0,sizeof(*e));
      e->m_sn = sn;
      e->m_sn_active = 1;
    }
  }
  else
  {
    if ( ON_SN_BLOCK::SN_BLOCK_CAPACITY == m_sn_block0.m_count )
    {
      // make room in m_sn_block0 for the new serial number
      GarbageCollectHelper();    
    }

    if ( 0 == m_sn_block0.m_count )
    {
      m_sn_block0.m_sn0 = m_sn_block0.m_sn1 = sn;
      m_sn_block0.m_sorted = 1;
    }
    else
    {
      if ( sn > m_sn_block0.m_sn1 )
      {
        m_sn_block0.m_sn1 = sn;
      }
      else
      {
        if ( sn < m_sn_block0.m_sn0 )
          m_sn_block0.m_sn0 = sn;
        m_sn_block0.m_sorted = 0;
      }        
    }
    if ( sn > m_private->MaxSn() )
      m_private->SetMaxSn(sn);
    if (sn < UINT32_MAX && sn > m_private->LowerMaxSn())
      m_private->SetLowerMaxSn(sn);

    m_sn_count++;
    e = &m_sn_block0.m_sn[m_sn_block0.m_count++];
    memset(e,0,sizeof(*e));
    e->m_sn = sn;
    e->m_sn_active = 1;
  }

  return e;
}